

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_layer.c
# Opt level: O1

REF_STATUS ref_layer_puff(REF_LAYER ref_layer,REF_GRID ref_grid)

{
  REF_INT node0;
  REF_DBL *pRVar1;
  REF_DBL *pRVar2;
  REF_CELL ref_cell;
  REF_ADJ_ITEM pRVar3;
  double dVar4;
  uint uVar5;
  REF_LIST pRVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  int iVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  ulong uVar16;
  REF_INT RVar17;
  REF_GRID pRVar18;
  double dVar19;
  double dVar20;
  REF_DBL angle;
  REF_INT node;
  REF_INT new_cell;
  REF_BOOL contains1;
  REF_BOOL contains0;
  REF_INT ncell;
  REF_DBL norm [3];
  REF_INT nodes [27];
  REF_DBL triangle_norm [3];
  REF_INT prism [27];
  uint local_210;
  REF_INT local_20c;
  REF_CELL local_208;
  REF_NODE local_200;
  REF_LAYER local_1f8;
  int local_1ec;
  undefined8 local_1e8;
  REF_GRID local_1e0;
  int local_1d8;
  int local_1d4;
  double local_1d0;
  int local_1c4;
  int local_1c0;
  int local_1bc;
  REF_DBL local_1b8;
  double dStack_1b0;
  double local_1a8;
  REF_CELL local_198;
  REF_CELL local_190;
  REF_INT local_188 [28];
  undefined8 local_118;
  REF_INT local_110;
  REF_INT local_a8 [3];
  int aiStack_9c [27];
  int iVar10;
  
  local_208 = ref_grid->cell[3];
  pRVar18 = ref_layer->ref_grid;
  local_200 = pRVar18->node;
  local_198 = pRVar18->cell[0];
  local_190 = pRVar18->cell[10];
  pRVar6 = ref_layer->ref_list;
  local_1f8 = ref_layer;
  local_1e0 = ref_grid;
  if (0 < pRVar6->n) {
    lVar12 = 0;
    do {
      uVar5 = ref_cell_nodes(local_208,pRVar6->value[lVar12],local_188);
      if (uVar5 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x85,"ref_layer_puff",(ulong)uVar5,"nodes");
        return uVar5;
      }
      if (0 < local_208->node_per) {
        lVar14 = 0;
        do {
          uVar5 = ref_node_add(local_200,(long)local_188[lVar14],&local_1d8);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                   ,0x87,"ref_layer_puff",(ulong)uVar5,"add");
            return uVar5;
          }
          iVar15 = local_188[lVar14];
          pRVar1 = local_1e0->node->real;
          pRVar2 = local_200->real;
          lVar7 = 0;
          do {
            pRVar2[(long)local_1d8 * 0xf + lVar7] = pRVar1[(long)iVar15 * 0xf + lVar7];
            lVar7 = lVar7 + 1;
          } while (lVar7 != 3);
          lVar14 = lVar14 + 1;
        } while (lVar14 < local_208->node_per);
      }
      lVar12 = lVar12 + 1;
      pRVar6 = local_1f8->ref_list;
    } while (lVar12 < pRVar6->n);
  }
  local_1ec = local_200->n;
  local_1f8->nnode_per_layer = local_1ec;
  local_20c = 0;
  if (0 < local_1ec) {
    do {
      uVar5 = ref_node_add(local_200,(long)local_20c + local_1e0->node->old_n_global,&local_1d8);
      if (uVar5 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x93,"ref_layer_puff",(ulong)uVar5,"add");
        return uVar5;
      }
      uVar13 = 0xffffffff;
      uVar16 = 0xffffffff;
      if (((-1 < (long)local_20c) && (uVar16 = 0xffffffff, local_20c < local_200->max)) &&
         (uVar16 = local_200->global[local_20c], (long)uVar16 < 0)) {
        uVar16 = 0xffffffffffffffff;
      }
      ref_cell = local_1e0->cell[3];
      local_1b8 = 0.0;
      dStack_1b0 = 0.0;
      local_1a8 = 0.0;
      iVar15 = (int)uVar16;
      if ((-1 < iVar15) && (iVar15 < ref_cell->ref_adj->nnode)) {
        uVar13 = (ulong)(uint)ref_cell->ref_adj->first[uVar16 & 0xffffffff];
      }
      iVar8 = (int)uVar13;
      if (iVar8 == -1) {
        RVar17 = -1;
      }
      else {
        RVar17 = ref_cell->ref_adj->item[iVar8].ref;
      }
      dVar19 = 0.0;
      dVar4 = local_1d0;
      while (local_1d0 = dVar19, iVar8 != -1) {
        uVar5 = ref_list_contains(local_1f8->ref_list,RVar17,&local_1d4);
        if (uVar5 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
                 0x5e,"ref_layer_normal",(ulong)uVar5,"in layer");
          dVar4 = local_1d0;
          goto LAB_00203ffb;
        }
        dVar19 = local_1d0;
        if (local_1d4 != 0) {
          uVar5 = ref_cell_nodes(ref_cell,RVar17,local_a8);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                   ,0x60,"ref_layer_normal",(ulong)uVar5,"tri nodes");
            dVar4 = local_1d0;
            goto LAB_00203ffb;
          }
          uVar5 = ref_node_tri_node_angle(local_1e0->node,local_a8,iVar15,(REF_DBL *)&local_1e8);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                   ,0x62,"ref_layer_normal",(ulong)uVar5,"angle");
            dVar4 = local_1d0;
            goto LAB_00203ffb;
          }
          uVar5 = ref_node_tri_normal(local_1e0->node,local_a8,(REF_DBL *)&local_118);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                   ,100,"ref_layer_normal",(ulong)uVar5,"norm");
            dVar4 = local_1d0;
            goto LAB_00203ffb;
          }
          uVar5 = ref_math_normalize((REF_DBL *)&local_118);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                   ,0x65,"ref_layer_normal",(ulong)uVar5,"normalize tri norm");
            dVar4 = local_1d0;
            goto LAB_00203ffb;
          }
          lVar12 = 0;
          do {
            (&local_1b8)[lVar12] =
                 (double)(&local_118)[lVar12] * (double)CONCAT44(local_1e8._4_4_,(REF_INT)local_1e8)
                 + (&local_1b8)[lVar12];
            lVar12 = lVar12 + 1;
          } while (lVar12 != 3);
          dVar19 = local_1d0 + (double)CONCAT44(local_1e8._4_4_,(REF_INT)local_1e8);
        }
        pRVar3 = ref_cell->ref_adj->item;
        iVar8 = pRVar3[(int)uVar13].next;
        uVar13 = (ulong)iVar8;
        dVar4 = local_1d0;
        if (uVar13 == 0xffffffffffffffff) {
          RVar17 = -1;
        }
        else {
          RVar17 = pRVar3[uVar13].ref;
        }
      }
      dVar19 = local_1d0 * 1e+20;
      if (dVar19 <= -dVar19) {
        dVar19 = -dVar19;
      }
      dVar20 = local_1b8;
      if (local_1b8 <= -local_1b8) {
        dVar20 = -local_1b8;
      }
      uVar5 = 4;
      if (dVar20 < dVar19) {
        dVar20 = dStack_1b0;
        if (dStack_1b0 <= -dStack_1b0) {
          dVar20 = -dStack_1b0;
        }
        if (dVar20 < dVar19) {
          dVar20 = local_1a8;
          if (local_1a8 <= -local_1a8) {
            dVar20 = -local_1a8;
          }
          if (dVar20 < dVar19) {
            lVar12 = 0;
            do {
              (&local_1b8)[lVar12] = (&local_1b8)[lVar12] / local_1d0;
              lVar12 = lVar12 + 1;
            } while (lVar12 != 3);
            local_1d0 = dVar4;
            uVar5 = ref_math_normalize(&local_1b8);
            if (uVar5 == 0) {
              uVar5 = 0;
              dVar4 = local_1d0;
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                     ,0x71,"ref_layer_normal",(ulong)uVar5,"normalize average norm");
              dVar4 = local_1d0;
            }
          }
        }
      }
LAB_00203ffb:
      local_1d0 = dVar4;
      if (uVar5 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x96,"ref_layer_puff",(ulong)uVar5,"normal");
        return uVar5;
      }
      pRVar1 = local_200->real;
      lVar12 = 0;
      do {
        pRVar1[(long)local_1d8 * 0xf + lVar12] =
             (&local_1b8)[lVar12] * 0.1 + pRVar1[(long)local_20c * 0xf + lVar12];
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
      local_20c = local_20c + 1;
    } while (local_20c < local_1ec);
  }
  pRVar6 = local_1f8->ref_list;
  if (0 < pRVar6->n) {
    lVar12 = 0;
    do {
      uVar5 = ref_cell_nodes(local_208,pRVar6->value[lVar12],local_188);
      if (uVar5 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x9f,"ref_layer_puff",(ulong)uVar5,"nodes");
        return uVar5;
      }
      if (0 < local_208->node_per) {
        lVar14 = 0;
        do {
          uVar5 = ref_node_local(local_200,(long)local_188[lVar14],&local_20c);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                   ,0xa1,"ref_layer_puff",(ulong)uVar5,"local");
            return uVar5;
          }
          local_a8[lVar14] = local_20c;
          aiStack_9c[lVar14] = local_20c + local_1ec;
          lVar14 = lVar14 + 1;
        } while (lVar14 < local_208->node_per);
      }
      uVar5 = ref_cell_add(local_190,local_a8,&local_1d4);
      if (uVar5 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0xa5,"ref_layer_puff",(ulong)uVar5,"add");
        return uVar5;
      }
      lVar12 = lVar12 + 1;
      pRVar6 = local_1f8->ref_list;
    } while (lVar12 < pRVar6->n);
  }
  pRVar6 = local_1f8->ref_list;
  if (pRVar6->n < 1) {
    uVar5 = 0;
  }
  else {
    pRVar18 = (REF_GRID)0x0;
    while( true ) {
      RVar17 = pRVar6->value[(long)pRVar18];
      uVar5 = ref_cell_nodes(local_208,RVar17,local_188);
      if (uVar5 != 0) break;
      local_1e0 = pRVar18;
      if (0 < local_208->edge_per) {
        local_1d0 = (double)CONCAT44(local_1d0._4_4_,RVar17);
        lVar12 = 0;
        do {
          node0 = local_188[local_208->e2n[lVar12 * 2]];
          iVar15 = local_188[local_208->e2n[lVar12 * 2 + 1]];
          uVar5 = ref_cell_list_with2(local_208,node0,iVar15,2,&local_1bc,(REF_INT *)&local_1e8);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                   ,0xb5,"ref_layer_puff",(ulong)uVar5,"find with 2");
            local_210 = uVar5;
          }
          iVar8 = local_1bc;
          iVar10 = 1;
          iVar9 = 1;
          iVar11 = iVar10;
          if (uVar5 == 0) {
            if ((long)local_1bc != 2) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                     ,0xb6,"ref_layer_puff","expected two tri for tri side",2,(long)local_1bc);
              local_210 = 1;
            }
            if (iVar8 == 2) {
              uVar5 = ref_list_contains(local_1f8->ref_list,(REF_INT)local_1e8,&local_1c0);
              iVar11 = iVar9;
              if (uVar5 == 0) {
                uVar5 = ref_list_contains(local_1f8->ref_list,local_1e8._4_4_,&local_1c4);
                if (uVar5 == 0) {
                  if (local_1c0 == 0 || local_1c4 == 0) {
                    if (local_1c0 == 0 && local_1c4 == 0) {
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                             ,0xbe,"ref_layer_puff","tri side is not in layer");
                      iVar11 = 1;
                      local_210 = 1;
                    }
                    else {
                      uVar5 = ref_node_local(local_200,(long)node0,&local_20c);
                      if (uVar5 == 0) {
                        local_118._0_4_ = local_20c + local_1ec;
                        uVar5 = ref_node_local(local_200,(long)iVar15,&local_20c);
                        iVar15 = local_1e8._4_4_;
                        if (uVar5 == 0) {
                          local_118._4_4_ = local_20c + local_1ec;
                          if (local_1c0 != 0) {
                            if (RVar17 != (REF_INT)local_1e8) {
                              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                     ,0xc4,"ref_layer_puff","cell should be in layer",(long)RVar17,
                                     (long)(REF_INT)local_1e8);
                              local_210 = 1;
                              goto LAB_00204684;
                            }
                            local_110 = local_208->c2n
                                        [(long)local_1e8._4_4_ * (long)local_208->size_per + 3];
                          }
                          if (local_1c4 != 0) {
                            if (local_1d0._0_4_ != local_1e8._4_4_) {
                              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                     ,200,"ref_layer_puff","cell should be in layer",(long)RVar17,
                                     (long)local_1e8._4_4_);
                              local_210 = 1;
                            }
                            if (local_1d0._0_4_ != iVar15) goto LAB_00204684;
                            local_110 = local_208->c2n
                                        [(long)(REF_INT)local_1e8 * (long)local_208->size_per + 3];
                          }
                          uVar5 = ref_cell_add(local_198,(REF_INT *)&local_118,&local_1d4);
                          if (uVar5 == 0) {
                            iVar11 = 0;
                          }
                          else {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                   ,0xcb,"ref_layer_puff",(ulong)uVar5,"add");
                            iVar11 = iVar10;
                            local_210 = uVar5;
                          }
                        }
                        else {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                 ,0xc1,"ref_layer_puff",(ulong)uVar5,"local");
                          local_210 = uVar5;
                        }
                      }
                      else {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                               ,0xbf,"ref_layer_puff",(ulong)uVar5,"local");
                        iVar11 = iVar10;
                        local_210 = uVar5;
                      }
                    }
                  }
                  else {
                    iVar11 = 0x1c;
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                         ,0xbc,"ref_layer_puff",(ulong)uVar5,"1 in layer");
                  local_210 = uVar5;
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                       ,0xb9,"ref_layer_puff",(ulong)uVar5,"0 in layer");
                local_210 = uVar5;
              }
            }
          }
LAB_00204684:
          if ((iVar11 != 0x1c) && (iVar11 != 0)) {
            return local_210;
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 < local_208->edge_per);
      }
      pRVar18 = (REF_GRID)((long)&local_1e0->mpi + 1);
      pRVar6 = local_1f8->ref_list;
      if ((long)pRVar6->n <= (long)pRVar18) {
        return 0;
      }
    }
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",0xab,
           "ref_layer_puff",(ulong)uVar5,"nodes");
  }
  return uVar5;
}

Assistant:

REF_FCN REF_STATUS ref_layer_puff(REF_LAYER ref_layer, REF_GRID ref_grid) {
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_NODE layer_node = ref_grid_node(ref_layer_grid(ref_layer));
  REF_CELL layer_prism = ref_grid_pri(ref_layer_grid(ref_layer));
  REF_CELL layer_edge = ref_grid_edg(ref_layer_grid(ref_layer));
  REF_INT item, cell, cell_node, cell_edge, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT prism[REF_CELL_MAX_SIZE_PER];
  REF_INT new_cell;
  REF_INT node, local, i, nnode_per_layer;
  REF_GLOB global;
  REF_DBL norm[3];

  /* first layer of nodes */
  each_ref_list_item(ref_layer_list(ref_layer), item) {
    cell = ref_list_value(ref_layer_list(ref_layer), item);
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    each_ref_cell_cell_node(ref_cell, cell_node) {
      RSS(ref_node_add(layer_node, nodes[cell_node], &node), "add");
      for (i = 0; i < 3; i++)
        ref_node_xyz(layer_node, i, node) =
            ref_node_xyz(ref_grid_node(ref_grid), i, nodes[cell_node]);
    }
  }
  nnode_per_layer = ref_node_n(layer_node);
  ref_layer->nnode_per_layer = nnode_per_layer;

  /* second layer of nodes */
  for (local = 0; local < nnode_per_layer; local++) {
    global = (REF_GLOB)local + ref_node_n_global(ref_grid_node(ref_grid));
    RSS(ref_node_add(layer_node, global, &node), "add");
    RSS(ref_layer_normal(ref_layer, ref_grid,
                         (REF_INT)ref_node_global(layer_node, local), norm),
        "normal");
    for (i = 0; i < 3; i++)
      ref_node_xyz(layer_node, i, node) =
          0.1 * norm[i] + ref_node_xyz(layer_node, i, local);
  }

  /* layer of prisms */
  each_ref_list_item(ref_layer_list(ref_layer), item) {
    cell = ref_list_value(ref_layer_list(ref_layer), item);
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    each_ref_cell_cell_node(ref_cell, cell_node) {
      RSS(ref_node_local(layer_node, nodes[cell_node], &local), "local");
      prism[cell_node] = local;
      prism[3 + cell_node] = local + nnode_per_layer;
    }
    RSS(ref_cell_add(layer_prism, prism, &new_cell), "add");
  }

  /* constrain faces */
  each_ref_list_item(ref_layer_list(ref_layer), item) {
    cell = ref_list_value(ref_layer_list(ref_layer), item);
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    each_ref_cell_cell_edge(ref_cell, cell_edge) {
      REF_INT node0;
      REF_INT node1;
      REF_INT ncell, cell_list[2];
      REF_BOOL contains0, contains1;
      REF_INT edge_nodes[REF_CELL_MAX_SIZE_PER];
      node0 = nodes[ref_cell_e2n_gen(ref_cell, 0, cell_edge)];
      node1 = nodes[ref_cell_e2n_gen(ref_cell, 1, cell_edge)];
      RSS(ref_cell_list_with2(ref_cell, node0, node1, 2, &ncell, cell_list),
          "find with 2");
      REIS(2, ncell, "expected two tri for tri side");
      RSS(ref_list_contains(ref_layer_list(ref_layer), cell_list[0],
                            &contains0),
          "0 in layer");
      RSS(ref_list_contains(ref_layer_list(ref_layer), cell_list[1],
                            &contains1),
          "1 in layer");
      if (contains0 && contains1) continue; /* tri side interior to layer */
      if (!contains0 && !contains1) THROW("tri side is not in layer");
      RSS(ref_node_local(layer_node, node0, &local), "local");
      edge_nodes[0] = local + nnode_per_layer;
      RSS(ref_node_local(layer_node, node1, &local), "local");
      edge_nodes[1] = local + nnode_per_layer;
      if (contains0) {
        REIS(cell, cell_list[0], "cell should be in layer");
        edge_nodes[2] = ref_cell_c2n(ref_cell, 3, cell_list[1]);
      }
      if (contains1) {
        REIS(cell, cell_list[1], "cell should be in layer");
        edge_nodes[2] = ref_cell_c2n(ref_cell, 3, cell_list[0]);
      }
      RSS(ref_cell_add(layer_edge, edge_nodes, &new_cell), "add");
    }
  }

  return REF_SUCCESS;
}